

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

int send_sasl_response(SASL_CLIENT_IO_INSTANCE *sasl_client_io,SASL_MECHANISM_BYTES sasl_response)

{
  int iVar1;
  SASL_RESPONSE_HANDLE sasl_response_00;
  LOGGER_LOG p_Var2;
  AMQP_VALUE sasl_frame_value;
  amqp_binary response_value;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE sasl_response_value;
  LOGGER_LOG l;
  amqp_binary response_binary_value;
  SASL_RESPONSE_HANDLE sasl_response_handle;
  int result;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_local;
  SASL_MECHANISM_BYTES sasl_response_local;
  
  response_value._12_4_ = 0;
  response_value.bytes = (void *)SUB128(sasl_response._0_12_,0);
  response_value.length = SUB124(sasl_response._0_12_,8);
  sasl_response_00 = sasl_response_create(response_value);
  if (sasl_response_00 == (SASL_RESPONSE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                ,"send_sasl_response",0x260,1,"Could not create SASL response");
    }
    sasl_response_handle._4_4_ = 0x261;
  }
  else {
    sasl_frame_value = amqpvalue_create_sasl_response(sasl_response_00);
    if (sasl_frame_value == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                  ,"send_sasl_response",0x268,1,"Could not create SASL response AMQP value");
      }
      sasl_response_handle._4_4_ = 0x269;
    }
    else {
      iVar1 = sasl_frame_codec_encode_frame
                        (sasl_client_io->sasl_frame_codec,sasl_frame_value,on_bytes_encoded,
                         sasl_client_io);
      if (iVar1 == 0) {
        if ((sasl_client_io->field_0x78 & 1) != 0) {
          log_outgoing_frame(sasl_frame_value);
        }
        sasl_response_handle._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                    ,"send_sasl_response",0x270,1,"Could not encode SASL response in the frame");
        }
        sasl_response_handle._4_4_ = 0x271;
      }
      amqpvalue_destroy(sasl_frame_value);
    }
    sasl_response_destroy(sasl_response_00);
  }
  return sasl_response_handle._4_4_;
}

Assistant:

static int send_sasl_response(SASL_CLIENT_IO_INSTANCE* sasl_client_io, SASL_MECHANISM_BYTES sasl_response)
{
    int result;

    SASL_RESPONSE_HANDLE sasl_response_handle;
    amqp_binary response_binary_value;

    response_binary_value.bytes = sasl_response.bytes;
    response_binary_value.length = sasl_response.length;

    /* Codes_SRS_SASLCLIENTIO_01_055: [Send the SASL response data as defined by the SASL specification.] */
    /* Codes_SRS_SASLCLIENTIO_01_056: [A block of opaque data passed to the security mechanism.] */
    if ((sasl_response_handle = sasl_response_create(response_binary_value)) == NULL)
    {
        LogError("Could not create SASL response");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE sasl_response_value = amqpvalue_create_sasl_response(sasl_response_handle);
        if (sasl_response_value == NULL)
        {
            LogError("Could not create SASL response AMQP value");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_SASLCLIENTIO_01_070: [When a frame needs to be sent as part of the SASL handshake frame exchange, the send shall be done by calling `sasl_frame_codec_encode_frame`.]*/
            if (sasl_frame_codec_encode_frame(sasl_client_io->sasl_frame_codec, sasl_response_value, on_bytes_encoded, sasl_client_io) != 0)
            {
                LogError("Could not encode SASL response in the frame");
                result = MU_FAILURE;
            }
            else
            {
                if (sasl_client_io->is_trace_on != 0)
                {
                    log_outgoing_frame(sasl_response_value);
                }

                result = 0;
            }

            amqpvalue_destroy(sasl_response_value);
        }

        sasl_response_destroy(sasl_response_handle);
    }

    return result;
}